

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::BitsFunction::~BitsFunction(BitsFunction *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

BitsFunction() : SystemSubroutine(KnownSystemName::Bits, SubroutineKind::Function) {}